

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O0

bool swrenderer::R_CheckClipWallSegment(int first,int last)

{
  short *local_20;
  cliprange_t *start;
  int last_local;
  int first_local;
  
  for (local_20 = (short *)solidsegs; local_20[1] < first; local_20 = local_20 + 2) {
  }
  if (first < *local_20) {
    last_local._3_1_ = true;
  }
  else if (local_20[1] < last) {
    last_local._3_1_ = true;
  }
  else {
    last_local._3_1_ = false;
  }
  return last_local._3_1_;
}

Assistant:

bool R_CheckClipWallSegment (int first, int last)
{
	cliprange_t *start;

	// Find the first range that touches the range
	// (adjacent pixels are touching).
	start = solidsegs;
	while (start->last < first)
		start++;

	if (first < start->first)
	{
		return true;
	}

	// Bottom contained in start?
	if (last > start->last)
	{
		return true;
	}

	return false;
}